

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVT.cpp
# Opt level: O1

void __thiscall OpenMD::FluctuatingChargeNVT::moveB(FluctuatingChargeNVT *this)

{
  pointer ppAVar1;
  DataStoragePointer DVar2;
  Snapshot *pSVar3;
  Molecule *pMVar4;
  pointer ppAVar5;
  pointer pdVar6;
  double *pdVar7;
  int iVar8;
  Atom *pAVar9;
  long lVar10;
  int iVar11;
  double dVar12;
  RealType RVar13;
  double dVar14;
  pair<double,_double> pVar15;
  MoleculeIterator i;
  MoleculeIterator local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  pair<double,_double> local_38;
  
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    local_58._M_node = (_Base_ptr)0x0;
    pVar15 = Snapshot::getElectronicThermostat(this->snap);
    local_50 = pVar15.second;
    dVar12 = pVar15.first;
    pMVar4 = SimInfo::beginMolecule((this->super_FluctuatingChargePropagator).info_,&local_58);
    if (pMVar4 != (Molecule *)0x0) {
      iVar11 = 0;
      do {
        ppAVar5 = (pMVar4->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppAVar1 = (pMVar4->fluctuatingCharges_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppAVar5 == ppAVar1) {
          pAVar9 = (Atom *)0x0;
        }
        else {
          pAVar9 = *ppAVar5;
        }
        if (pAVar9 != (Atom *)0x0) {
          pdVar6 = (this->oldVel_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar11;
          do {
            ppAVar5 = ppAVar5 + 1;
            *pdVar6 = *(double *)
                       (*(long *)((long)&(((pAVar9->super_StuntDouble).snapshotMan_)->
                                          currentSnapshot_->atomData).flucQVel.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start +
                                 (pAVar9->super_StuntDouble).storage_) +
                       (long)(pAVar9->super_StuntDouble).localIndex_ * 8);
            if (ppAVar5 == ppAVar1) {
              pAVar9 = (Atom *)0x0;
            }
            else {
              pAVar9 = *ppAVar5;
            }
            pdVar6 = pdVar6 + 1;
            iVar11 = iVar11 + 1;
          } while (pAVar9 != (Atom *)0x0);
        }
        pMVar4 = SimInfo::nextMolecule((this->super_FluctuatingChargePropagator).info_,&local_58);
      } while (pMVar4 != (Molecule *)0x0);
    }
    dVar14 = dVar12;
    if (0 < this->maxIterNum_) {
      iVar11 = 0;
      do {
        uStack_40 = 0;
        local_48 = dVar14;
        RVar13 = Thermo::getElectronicTemperature(&this->thermo);
        dVar14 = ((RVar13 / this->targetTemp_ + -1.0) * this->dt2_) /
                 (this->tauThermostat_ * this->tauThermostat_) + dVar12;
        pMVar4 = SimInfo::beginMolecule((this->super_FluctuatingChargePropagator).info_,&local_58);
        if (pMVar4 != (Molecule *)0x0) {
          iVar8 = 0;
          do {
            ppAVar5 = (pMVar4->fluctuatingCharges_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            ppAVar1 = (pMVar4->fluctuatingCharges_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (ppAVar5 == ppAVar1) {
              pAVar9 = (Atom *)0x0;
            }
            else {
              pAVar9 = *ppAVar5;
            }
            if (pAVar9 != (Atom *)0x0) {
              pdVar7 = (this->oldVel_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + iVar8;
              do {
                ppAVar5 = ppAVar5 + 1;
                DVar2 = (pAVar9->super_StuntDouble).storage_;
                pSVar3 = ((pAVar9->super_StuntDouble).snapshotMan_)->currentSnapshot_;
                lVar10 = (long)(pAVar9->super_StuntDouble).localIndex_;
                *(double *)
                 (*(long *)((long)&(pSVar3->atomData).flucQVel.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start + DVar2) + lVar10 * 8) =
                     ((*(double *)
                        (*(long *)((long)&(pSVar3->atomData).flucQFrc.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + DVar2) +
                        lVar10 * 8) * this->dt2_) / pAVar9->chargeMass_ + *pdVar7) -
                     this->dt2_ * dVar14 * *pdVar7;
                if (ppAVar5 == ppAVar1) {
                  pAVar9 = (Atom *)0x0;
                }
                else {
                  pAVar9 = *ppAVar5;
                }
                pdVar7 = pdVar7 + 1;
                iVar8 = iVar8 + 1;
              } while (pAVar9 != (Atom *)0x0);
            }
            pMVar4 = SimInfo::nextMolecule
                               ((this->super_FluctuatingChargePropagator).info_,&local_58);
          } while (pMVar4 != (Molecule *)0x0);
        }
      } while ((this->chiTolerance_ < ABS(local_48 - dVar14)) &&
              (iVar11 = iVar11 + 1, iVar11 < this->maxIterNum_));
    }
    local_38.second = this->dt2_ * dVar14 + local_50;
    local_38.first = dVar14;
    Snapshot::setElectronicThermostat(this->snap,&local_38);
  }
  return;
}

Assistant:

void FluctuatingChargeNVT::moveB() {
    if (!hasFlucQ_) return;
    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType instTemp;
    pair<RealType, RealType> thermostat = snap->getElectronicThermostat();
    RealType chi                        = thermostat.first;
    RealType oldChi                     = chi;
    RealType prevChi;
    RealType integralOfChidt = thermostat.second;
    int index;
    RealType cfrc, cvel, cmass;

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        oldVel_[index] = atom->getFlucQVel();
        ++index;
      }
    }

    // do the iteration:

    for (int k = 0; k < maxIterNum_; k++) {
      index    = 0;
      instTemp = thermo.getElectronicTemperature();
      // evolve chi another half step using the temperature at t + dt/2
      prevChi = chi;
      chi     = oldChi + dt2_ * (instTemp / targetTemp_ - 1.0) /
                         (tauThermostat_ * tauThermostat_);

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          cfrc  = atom->getFlucQFrc();
          cmass = atom->getChargeMass();

          // velocity half step
          cvel = oldVel_[index] + dt2_ * cfrc / cmass -
                 dt2_ * chi * oldVel_[index];
          atom->setFlucQVel(cvel);
          ++index;
        }
      }
      if (fabs(prevChi - chi) <= chiTolerance_) break;
    }
    integralOfChidt += dt2_ * chi;
    snap->setElectronicThermostat(make_pair(chi, integralOfChidt));
  }